

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O0

ConversionResult
convertUTF::ConvertUTF16toUTF8
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF8 **targetStart,UTF8 *targetEnd,
          ConversionFlags flags)

{
  UTF8 *pUVar1;
  uint uVar2;
  ushort *puVar3;
  uint local_54;
  UTF32 ch2;
  UTF32 ch;
  UTF16 *oldSource;
  UTF8 *pUStack_40;
  unsigned_short bytesToWrite;
  UTF8 *target;
  UTF16 *source;
  ConversionResult result;
  ConversionFlags flags_local;
  UTF8 *targetEnd_local;
  UTF8 **targetStart_local;
  UTF16 *sourceEnd_local;
  UTF16 **sourceStart_local;
  
  source._0_4_ = conversionOK;
  target = (UTF8 *)*sourceStart;
  pUStack_40 = *targetStart;
  do {
    pUVar1 = target;
    if (sourceEnd <= target) {
LAB_00294ca6:
      *sourceStart = (UTF16 *)pUVar1;
      *targetStart = pUStack_40;
      return (ConversionResult)source;
    }
    puVar3 = (ushort *)(target + 2);
    local_54 = (uint)*(ushort *)target;
    if ((local_54 < 0xd800) || (0xdbff < local_54)) {
      target = (UTF8 *)puVar3;
      if ((flags == strictConversion) && ((0xdbff < local_54 && (local_54 < 0xe000)))) {
        source._0_4_ = sourceIllegal;
        goto LAB_00294ca6;
      }
    }
    else {
      if (sourceEnd <= puVar3) {
        source._0_4_ = sourceExhausted;
        goto LAB_00294ca6;
      }
      uVar2 = (uint)*puVar3;
      if ((uVar2 < 0xdc00) || (0xdfff < uVar2)) {
        target = (UTF8 *)puVar3;
        if (flags == strictConversion) {
          source._0_4_ = sourceIllegal;
          goto LAB_00294ca6;
        }
      }
      else {
        local_54 = (local_54 - 0xd800) * 0x400 + uVar2 + 0x2400;
        target = target + 4;
      }
    }
    if (local_54 < 0x80) {
      oldSource._6_2_ = 1;
    }
    else if (local_54 < 0x800) {
      oldSource._6_2_ = 2;
    }
    else if (local_54 < 0x10000) {
      oldSource._6_2_ = 3;
    }
    else if (local_54 < 0x110000) {
      oldSource._6_2_ = 4;
    }
    else {
      oldSource._6_2_ = 3;
      local_54 = 0xfffd;
    }
    pUStack_40 = pUStack_40 + (int)(uint)oldSource._6_2_;
    if (targetEnd < pUStack_40) {
      pUStack_40 = pUStack_40 + -(long)(int)(uint)oldSource._6_2_;
      source._0_4_ = targetExhausted;
      goto LAB_00294ca6;
    }
    switch(oldSource._6_2_) {
    case 4:
      pUStack_40[-1] = (byte)local_54 & 0xbf | 0x80;
      local_54 = local_54 >> 6;
      pUStack_40 = pUStack_40 + -1;
    case 3:
      pUStack_40[-1] = (byte)local_54 & 0xbf | 0x80;
      local_54 = local_54 >> 6;
      pUStack_40 = pUStack_40 + -1;
    case 2:
      pUStack_40[-1] = (byte)local_54 & 0xbf | 0x80;
      local_54 = local_54 >> 6;
      pUStack_40 = pUStack_40 + -1;
    case 1:
      pUStack_40[-1] = (byte)local_54 | *(byte *)((long)&firstByteMark + (ulong)oldSource._6_2_);
      pUStack_40 = pUStack_40 + -1;
    default:
      pUStack_40 = pUStack_40 + (int)(uint)oldSource._6_2_;
    }
  } while( true );
}

Assistant:

ConversionResult ConvertUTF16toUTF8(const UTF16** sourceStart, const UTF16* sourceEnd, UTF8** targetStart,
                                    const UTF8* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF16* source = *sourceStart;
    UTF8* target = *targetStart;
    while (source < sourceEnd)
    {
        unsigned short bytesToWrite;
        static constexpr UTF32 byteMask = 0xBF;
        static constexpr UTF32 byteMark = 0x80;
        const UTF16* oldSource = source; /* In case we have to back up because of target overflow. */
        UTF32 ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END)
        {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd)
            {
                const UTF32 ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END)
                {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift) + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                }
                else if (flags == ConversionFlags::strictConversion)
                {             /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
            }
            else
            {             /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = ConversionResult::sourceExhausted;
                break;
            }
        }
        else if (flags == ConversionFlags::strictConversion)
        {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END)
            {
                --source; /* return to the illegal value itself */
                result = ConversionResult::sourceIllegal;
                break;
            }
        }
        /* Figure out how many bytes the result will require */
        if (ch < 0x80)
        {
            bytesToWrite = 1;
        }
        else if (ch < 0x800)
        {
            bytesToWrite = 2;
        }
        else if (ch < 0x10000)
        {
            bytesToWrite = 3;
        }
        else if (ch < 0x110000)
        {
            bytesToWrite = 4;
        }
        else
        {
            bytesToWrite = 3;
            ch = UNI_REPLACEMENT_CHAR;
        }

        target += bytesToWrite;
        if (target > targetEnd)
        {
            source = oldSource; /* Back up source pointer! */
            target -= bytesToWrite;
            result = ConversionResult::targetExhausted;
            break;
        }
        switch (bytesToWrite)
        { /* note: everything falls through. */
        case 4:
            *--target = (ch | byteMark) & byteMask;
            ch >>= 6;
            [[fallthrough]];
        case 3:
            *--target = (ch | byteMark) & byteMask;
            ch >>= 6;
            [[fallthrough]];
        case 2:
            *--target = (ch | byteMark) & byteMask;
            ch >>= 6;
            [[fallthrough]];
        case 1:
            *--target = static_cast<UTF8>(ch | firstByteMark[bytesToWrite]);
            break;
        default:;
        }
        target += bytesToWrite;
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}